

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_key_anchors_and_refs(Parser *this)

{
  State *pSVar1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  csubstr s;
  bool bVar7;
  undefined1 uVar8;
  bool bVar9;
  size_t sVar10;
  csubstr rem;
  char msg [31];
  basic_substring<const_char> local_108;
  basic_substring<const_char> local_f8;
  undefined6 uStack_e8;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined6 uStack_e0;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  char acStack_d8 [40];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  char *pcStack_48;
  undefined8 local_40;
  char *local_38;
  size_t sStack_30;
  
  if ((this->m_state->flags & 0x80) != 0) {
    uStack_e8 = 0x6e615f736168;
    uStack_e2 = 0x79;
    uStack_e1 = 0x28;
    uStack_e0 = 0x29294c415652;
    uStack_da = 0;
    local_f8.str = (char *)0x6166206b63656863;
    local_f8.len._0_6_ = 0x203a64656c69;
    local_f8.len._6_1_ = 0x28;
    local_f8.len._7_1_ = 0x21;
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      uVar8 = (*pcVar3)();
      return (bool)uVar8;
    }
    local_88 = 0;
    uStack_80 = 0x7185;
    local_78 = 0;
    pcStack_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_68 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7185) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7185) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_f8,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar1 = this->m_state;
  local_108.str = (pSVar1->line_contents).rem.str;
  local_108.len = (pSVar1->line_contents).rem.len;
  if (local_108.len == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = *local_108.str == '&';
  }
  if (bVar7 == false) {
    if (local_108.len == 0) {
      return bVar7;
    }
    if (*local_108.str != '*') {
      return bVar7;
    }
    _handle_key_anchors_and_refs(this);
  }
  else if ((~pSVar1->flags & 0x220U) == 0) {
    if ((pSVar1->flags & 0x40U) == 0) {
      uStack_e8 = 0x796e615f7361;
      uStack_e2 = 0x28;
      uStack_e1 = 0x52;
      uStack_e0 = 0x292959454b;
      local_f8.str = (char *)0x6166206b63656863;
      local_f8.len._0_6_ = 0x203a64656c69;
      local_f8.len._6_1_ = 0x28;
      local_f8.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        uVar8 = (*pcVar3)();
        return (bool)uVar8;
      }
      local_b0 = 0;
      uStack_a8 = 0x718c;
      local_a0 = 0;
      pcStack_98 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_90 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x718c) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x718c) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_f8,0x1e,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar2 = (this->m_buf).str;
    if ((local_108.str + -1 < pcVar2) || (pcVar2 + (this->m_buf).len < local_108.str + -1)) {
      builtin_strncpy(acStack_d8 + 0x10,"buf.end())",0xb);
      builtin_strncpy(acStack_d8,"n() && str <= m_",0x10);
      uStack_e8 = 0x203d3e207274;
      uStack_e2 = 0x6d;
      uStack_e1 = 0x5f;
      uStack_e0 = 0x65622e667562;
      uStack_da = 0x67;
      uStack_d9 = 0x69;
      local_f8.str = (char *)0x6166206b63656863;
      local_f8.len._0_6_ = 0x203a64656c69;
      local_f8.len._6_1_ = 0x28;
      local_f8.len._7_1_ = 0x73;
      if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        uVar8 = (*pcVar3)();
        return (bool)uVar8;
      }
      local_60 = 0;
      uStack_58 = 0x5e96;
      local_50 = 0;
      pcStack_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_40 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_f8,0x3b,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    _append_key_val(this,(csubstr)ZEXT816(0),0);
    this->m_state->flags = this->m_state->flags & 0xffffffdf;
    return bVar7;
  }
  sVar10 = basic_substring<const_char>::first_of(&local_108,' ',0);
  if ((sVar10 != 0xffffffffffffffff) && (local_108.len < sVar10)) {
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      uVar8 = (*pcVar3)();
      return (bool)uVar8;
    }
    handle_error(0x1ff947,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1569,"pos <= len || pos == npos");
  }
  if (sVar10 == 0xffffffffffffffff) {
    local_f8.str = local_108.str;
    local_f8.len._0_6_ = (undefined6)local_108.len;
    local_f8.len._6_1_ = (undefined1)(local_108.len >> 0x30);
    local_f8.len._7_1_ = (undefined1)(local_108.len >> 0x38);
  }
  else {
    basic_substring<const_char>::basic_substring(&local_f8,local_108.str,sVar10);
  }
  pcVar2 = local_f8.str;
  sVar10 = CONCAT17(local_f8.len._7_1_,CONCAT16(local_f8.len._6_1_,(undefined6)local_f8.len));
  _line_progressed(this,sVar10);
  if (sVar10 != 0) {
    basic_substring<const_char>::basic_substring(&local_f8,pcVar2 + 1,sVar10 - 1);
    sStack_30 = CONCAT17(local_f8.len._7_1_,CONCAT16(local_f8.len._6_1_,(undefined6)local_f8.len));
    local_38 = local_f8.str;
    _move_key_anchor_to_val_anchor(this);
    (this->m_key_anchor).str = local_38;
    (this->m_key_anchor).len = sStack_30;
    s.len = local_108.len;
    s.str = local_108.str;
    sVar10 = LineContents::current_col(&this->m_state->line_contents,s);
    this->m_key_anchor_indentation = sVar10;
    return bVar7;
  }
  if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar3 = (code *)swi(3);
    uVar8 = (*pcVar3)();
    return (bool)uVar8;
  }
  handle_error(0x1ff947,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

bool Parser::_handle_key_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RVAL));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        _c4dbgp("found a key anchor!!!");
        if(has_all(QMRK|SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
            _c4dbgp("there is a stored key, so this anchor is for the next element");
            _append_key_val_null(rem.str - 1);
            rem_flags(QMRK);
            return true;
        }
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _move_key_anchor_to_val_anchor();
        _c4dbgpf("key anchor value: '{}'", anchor);
        m_key_anchor = anchor;
        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}